

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.c
# Opt level: O2

InterpretResult interpret(Vm *vm,char *source)

{
  CallFrame *pCVar1;
  int iVar2;
  InterpretResult IVar3;
  Compiler compiler;
  
  init_compiler(&compiler,source);
  memcpy(&vm->compiler,&compiler,0x10a8);
  iVar2 = compile(vm);
  if (iVar2 == 0) {
    pCVar1 = (vm->frames).frame_pointers[vm->frame_count - 1];
    pCVar1->ip = (pCVar1->code_buffer).code;
    vm->current_status = VM_STATUS_RUNNING;
    IVar3 = run(vm);
    var_ht_free((vm->compiler).scope);
  }
  else {
    IVar3 = INTERPRET_COMPILE_ERROR;
  }
  return IVar3;
}

Assistant:

InterpretResult interpret(Vm *vm, const char *source) {
    Compiler compiler;
    init_compiler(&compiler, source);

    vm->compiler = compiler;
    int compile_result = compile(vm);

    if (compile_result) {
        return INTERPRET_COMPILE_ERROR;
    }

#if DEBUG_SHOW_DISASSEMBLY
    disassemble_curr_frame(vm, "Main Program");
#endif

    CURR_FRAME(vm)->ip = CURR_FRAME(vm)->code_buffer.code;
    vm->current_status = VM_STATUS_RUNNING;
    InterpretResult result = run(vm);
    free_compiler(&vm->compiler);

    return result;
}